

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int insertCellFast(MemPage *pPage,int i,u8 *pCell,int sz)

{
  byte bVar1;
  u8 uVar2;
  long lVar3;
  u8 *puVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  u8 *puVar8;
  u8 *puVar9;
  int in_ECX;
  u8 *in_RDX;
  int in_ESI;
  MemPage *in_RDI;
  long in_FS_OFFSET;
  int rc;
  u8 *pIns;
  u8 *data;
  int j;
  int g2;
  u8 *pSpace;
  int gap;
  u8 *pTmp;
  int top;
  u8 *data_1;
  int hdr;
  int rc2;
  int idx;
  int rc_1;
  PgHdr *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  MemPage *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffff88;
  int local_68;
  uint local_44;
  undefined4 in_stack_ffffffffffffffc8;
  int local_18;
  int local_10;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0;
  uVar10 = 0xaaaaaaaa;
  if (in_RDI->nFree < in_ECX + 2) {
    bVar1 = in_RDI->nOverflow;
    in_RDI->nOverflow = bVar1 + 1;
    in_RDI->apOvfl[(int)(uint)bVar1] = in_RDX;
    in_RDI->aiOvfl[(int)(uint)bVar1] = (u16)in_ESI;
  }
  else {
    local_68 = sqlite3PagerWrite(in_stack_ffffffffffffff48);
    if (local_68 != 0) goto LAB_00192d50;
    puVar4 = in_RDI->aData;
    uVar5 = (uint)in_RDI->hdrOffset;
    puVar9 = in_RDI->aData;
    uVar6 = (uint)in_RDI->cellOffset + (uint)in_RDI->nCell * 2;
    local_44 = (uint)CONCAT11(puVar9[(int)(uVar5 + 5)],(puVar9 + (int)(uVar5 + 5))[1]);
    if (local_44 < uVar6) {
      if ((local_44 == 0) && (in_RDI->pBt->usableSize == 0x10000)) {
        local_44 = 0x10000;
LAB_001929c3:
        iVar7 = in_ECX;
        if ((((puVar9[(int)(uVar5 + 2)] == '\0') && (puVar9[(int)(uVar5 + 1)] == '\0')) ||
            (local_44 < uVar6 + 2)) ||
           (puVar8 = pageFindSlot((MemPage *)CONCAT44(in_ESI,in_stack_ffffffffffffff88),
                                  (int)((ulong)in_RDX >> 0x20),(int *)CONCAT44(in_ECX,uVar10)),
           puVar8 == (u8 *)0x0)) {
          if ((int)local_44 < (int)(uVar6 + 2 + in_ECX)) {
            if (in_RDI->nFree - (in_ECX + 2) < 5) {
              in_stack_ffffffffffffff54 = in_RDI->nFree - (in_ECX + 2);
            }
            else {
              in_stack_ffffffffffffff54 = 4;
            }
            in_stack_ffffffffffffff58 = in_RDI;
            local_18 = defragmentPage((MemPage *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),
                                      (int)((ulong)puVar9 >> 0x20));
            if (local_18 != 0) goto LAB_00192bed;
            local_44 = (CONCAT11(puVar9[(int)(uVar5 + 5)],puVar9[(long)(int)(uVar5 + 5) + 1]) - 1 &
                       0xffff) + 1;
          }
          local_10 = local_44 - in_ECX;
          puVar9[(int)(uVar5 + 5)] = (u8)((uint)local_10 >> 8);
          puVar9[(long)(int)(uVar5 + 5) + 1] = (u8)local_10;
          local_18 = 0;
        }
        else {
          local_10 = (int)puVar8 - (int)puVar9;
          if ((int)uVar6 < local_10) {
            local_18 = 0;
          }
          else {
            local_18 = sqlite3CorruptError(0);
          }
        }
      }
      else {
        local_18 = sqlite3CorruptError(0);
        iVar7 = in_ECX;
      }
    }
    else {
      if ((int)local_44 <= (int)in_RDI->pBt->usableSize) goto LAB_001929c3;
      local_18 = sqlite3CorruptError(0);
      iVar7 = in_ECX;
    }
LAB_00192bed:
    if (local_18 != 0) {
      local_68 = local_18;
      goto LAB_00192d50;
    }
    in_RDI->nFree = in_RDI->nFree - (iVar7 + 2U & 0xffff);
    memcpy(puVar4 + local_10,in_RDX,(long)iVar7);
    puVar9 = in_RDI->aCellIdx + (in_ESI << 1);
    memmove(puVar9 + 2,puVar9,(long)(int)(((uint)in_RDI->nCell - in_ESI) * 2));
    *puVar9 = (u8)((uint)local_10 >> 8);
    puVar9[1] = (u8)local_10;
    in_RDI->nCell = in_RDI->nCell + 1;
    iVar7 = in_RDI->hdrOffset + 4;
    uVar2 = puVar4[iVar7];
    puVar4[iVar7] = uVar2 + '\x01';
    if ((u8)(uVar2 + '\x01') == '\0') {
      iVar7 = in_RDI->hdrOffset + 3;
      puVar4[iVar7] = puVar4[iVar7] + '\x01';
    }
    if (in_RDI->pBt->autoVacuum != '\0') {
      ptrmapPutOvflPtr((MemPage *)CONCAT44(local_18,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58,
                       (u8 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (int *)in_stack_ffffffffffffff48);
    }
  }
  local_68 = 0;
LAB_00192d50:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return local_68;
}

Assistant:

static int insertCellFast(
  MemPage *pPage,   /* Page into which we are copying */
  int i,            /* New cell becomes the i-th cell of the page */
  u8 *pCell,        /* Content of the new cell */
  int sz            /* Bytes of content in pCell */
){
  int idx = 0;      /* Where to write new cell content in data[] */
  int j;            /* Loop counter */
  u8 *data;         /* The content of the whole page */
  u8 *pIns;         /* The point in pPage->aCellIdx[] where no cell inserted */

  assert( i>=0 && i<=pPage->nCell+pPage->nOverflow );
  assert( MX_CELL(pPage->pBt)<=10921 );
  assert( pPage->nCell<=MX_CELL(pPage->pBt) || CORRUPT_DB );
  assert( pPage->nOverflow<=ArraySize(pPage->apOvfl) );
  assert( ArraySize(pPage->apOvfl)==ArraySize(pPage->aiOvfl) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sz==pPage->xCellSize(pPage, pCell) || CORRUPT_DB );
  assert( pPage->nFree>=0 );
  assert( pPage->nOverflow==0 );
  if( sz+2>pPage->nFree ){
    j = pPage->nOverflow++;
    /* Comparison against ArraySize-1 since we hold back one extra slot
    ** as a contingency.  In other words, never need more than 3 overflow
    ** slots but 4 are allocated, just to be safe. */
    assert( j < ArraySize(pPage->apOvfl)-1 );
    pPage->apOvfl[j] = pCell;
    pPage->aiOvfl[j] = (u16)i;

    /* When multiple overflows occur, they are always sequential and in
    ** sorted order.  This invariants arise because multiple overflows can
    ** only occur when inserting divider cells into the parent page during
    ** balancing, and the dividers are adjacent and sorted.
    */
    assert( j==0 || pPage->aiOvfl[j-1]<(u16)i ); /* Overflows in sorted order */
    assert( j==0 || i==pPage->aiOvfl[j-1]+1 );   /* Overflows are sequential */
  }else{
    int rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    assert( sqlite3PagerIswriteable(pPage->pDbPage) );
    data = pPage->aData;
    assert( &data[pPage->cellOffset]==pPage->aCellIdx );
    rc = allocateSpace(pPage, sz, &idx);
    if( rc ){ return rc; }
    /* The allocateSpace() routine guarantees the following properties
    ** if it returns successfully */
    assert( idx >= 0 );
    assert( idx >= pPage->cellOffset+2*pPage->nCell+2 || CORRUPT_DB );
    assert( idx+sz <= (int)pPage->pBt->usableSize );
    pPage->nFree -= (u16)(2 + sz);
    memcpy(&data[idx], pCell, sz);
    pIns = pPage->aCellIdx + i*2;
    memmove(pIns+2, pIns, 2*(pPage->nCell - i));
    put2byte(pIns, idx);
    pPage->nCell++;
    /* increment the cell count */
    if( (++data[pPage->hdrOffset+4])==0 ) data[pPage->hdrOffset+3]++;
    assert( get2byte(&data[pPage->hdrOffset+3])==pPage->nCell || CORRUPT_DB );
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pPage->pBt->autoVacuum ){
      int rc2 = SQLITE_OK;
      /* The cell may contain a pointer to an overflow page. If so, write
      ** the entry for the overflow page into the pointer map.
      */
      ptrmapPutOvflPtr(pPage, pPage, pCell, &rc2);
      if( rc2 ) return rc2;
    }
#endif
  }
  return SQLITE_OK;
}